

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void JSON::writeNext(Pipeline *p,bool *first,size_t depth)

{
  allocator<char> local_31;
  string s;
  
  if (*first == true) {
    *first = false;
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"\n",&local_31);
    std::__cxx11::string::append((ulong)&s,(char)depth * '\x02');
    Pipeline::operator<<(p,&s);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,",\n",&local_31);
    std::__cxx11::string::append((ulong)&s,(char)depth * '\x02');
    Pipeline::operator<<(p,&s);
  }
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void
JSON::writeNext(Pipeline* p, bool& first, size_t depth)
{
    if (first) {
        first = false;
        std::string s{"\n"};
        s.append(2 * depth, ' ');
        *p << s;
    } else {
        std::string s{",\n"};
        s.append(2 * depth, ' ');
        *p << s;
    }
}